

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

JSONNode ** __thiscall internalJSONNode::at(internalJSONNode *this,json_string *name_t)

{
  char *pcVar1;
  jsonChildren *pjVar2;
  JSONNode *pJVar3;
  internalJSONNode *piVar4;
  pointer pcVar5;
  string asVar6 [8];
  int iVar7;
  json_string *__lhs;
  JSONNode **ppJVar8;
  JSONNode **ppJVar9;
  bool bVar10;
  size_type __dnew;
  undefined1 local_70 [32];
  string local_50 [8];
  size_t local_48;
  char local_40 [16];
  
  if ((this->_type & 0xfe) == 4) {
    Fetch(this);
    pjVar2 = this->Children;
    pcVar1 = local_70 + 0x10;
    local_50 = (string  [8])0x16;
    local_70._0_8_ = pcVar1;
    local_70._0_8_ = std::__cxx11::string::_M_create((ulong *)local_70,(ulong)local_50);
    local_70._16_7_ = local_50._0_7_;
    local_70[0x17] = local_50[7];
    builtin_strncpy((char *)local_70._0_8_,"Children is null begin",0x16);
    local_70[8] = local_50[0];
    local_70[9] = local_50[1];
    local_70[10] = local_50[2];
    local_70[0xb] = local_50[3];
    local_70[0xc] = local_50[4];
    local_70[0xd] = local_50[5];
    local_70[0xe] = local_50[6];
    local_70[0xf] = local_50[7];
    *(char *)(local_70._0_8_ + (long)local_50) = '\0';
    JSONDebug::_JSON_ASSERT(true,(json_string *)local_70);
    if ((char *)local_70._0_8_ != pcVar1) {
      operator_delete((void *)local_70._0_8_);
    }
    ppJVar8 = pjVar2->array;
    pjVar2 = this->Children;
    local_50 = (string  [8])0x14;
    local_70._0_8_ = pcVar1;
    local_70._0_8_ = std::__cxx11::string::_M_create((ulong *)local_70,(ulong)local_50);
    local_70._16_7_ = local_50._0_7_;
    local_70[0x17] = local_50[7];
    builtin_strncpy((char *)local_70._0_8_,"Children is null end",0x14);
    local_70[8] = local_50[0];
    local_70[9] = local_50[1];
    local_70[10] = local_50[2];
    local_70[0xb] = local_50[3];
    local_70[0xc] = local_50[4];
    local_70[0xd] = local_50[5];
    local_70[0xe] = local_50[6];
    local_70[0xf] = local_50[7];
    *(char *)(local_70._0_8_ + (long)local_50) = '\0';
    JSONDebug::_JSON_ASSERT(true,(json_string *)local_70);
    if ((char *)local_70._0_8_ != pcVar1) {
      operator_delete((void *)local_70._0_8_);
    }
    ppJVar9 = pjVar2->array + pjVar2->mysize;
    if (ppJVar8 != ppJVar9) {
      do {
        pJVar3 = *ppJVar8;
        if (jsonSingletonERROR_NULL_IN_CHILDREN::getValue[abi:cxx11]()::single == '\0') {
          at();
        }
        JSONDebug::_JSON_ASSERT
                  (pJVar3 != (JSONNode *)0x0,
                   (json_string *)jsonSingletonERROR_NULL_IN_CHILDREN::getValue[abi:cxx11]()::single
                  );
        pJVar3 = *ppJVar8;
        local_70._16_7_ = 0x65746e69206f6e;
        local_70._23_4_ = 0x6c616e72;
        local_70._8_8_ = (char *)0xb;
        local_70[0x1b] = '\0';
        local_70._0_8_ = pcVar1;
        JSONDebug::_JSON_ASSERT(pJVar3->internal != (internalJSONNode *)0x0,(json_string *)local_70)
        ;
        if ((char *)local_70._0_8_ != pcVar1) {
          operator_delete((void *)local_70._0_8_);
        }
        piVar4 = pJVar3->internal;
        pcVar5 = (piVar4->_name)._M_dataplus._M_p;
        local_50 = (string  [8])local_40;
        std::__cxx11::string::_M_construct<char*>
                  (local_50,pcVar5,pcVar5 + (piVar4->_name)._M_string_length);
        asVar6 = local_50;
        if (local_48 == name_t->_M_string_length) {
          if (local_48 == 0) {
            bVar10 = true;
          }
          else {
            iVar7 = bcmp((void *)local_50,(name_t->_M_dataplus)._M_p,local_48);
            bVar10 = iVar7 == 0;
          }
        }
        else {
          bVar10 = false;
        }
        if (asVar6 != (string  [8])local_40) {
          operator_delete((void *)asVar6);
        }
        if (bVar10) {
          return ppJVar8;
        }
        ppJVar8 = ppJVar8 + 1;
      } while (ppJVar8 != ppJVar9);
    }
  }
  else {
    __lhs = jsonSingletonERROR_NON_CONTAINER::getValue_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   __lhs,"at");
    at((internalJSONNode *)local_70);
  }
  return (JSONNode **)0x0;
}

Assistant:

JSONNode ** internalJSONNode::at(const json_string & name_t) json_nothrow {
    JSON_ASSERT_SAFE(isContainer(), json_global(ERROR_NON_CONTAINER) + JSON_TEXT("at"), return 0;);
    Fetch();
    json_foreach(CHILDREN, myrunner){
	   JSON_ASSERT(*myrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
	   if (json_unlikely((*myrunner) -> name() == name_t)) return myrunner;
    }
    return 0;
}